

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__math
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__mathml__overflow EVar2;
  ENUM__mathml__display EVar3;
  StackMemoryManager *this_00;
  char **ppcVar4;
  long *in_RSI;
  bool *in_RDI;
  StringHashPair hashPair;
  bool failed_4;
  bool failed_3;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  math__AttributeData *attributeData;
  URI *in_stack_fffffffffffffba8;
  URI *other;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_stack_fffffffffffffbb0;
  void **in_stack_fffffffffffffbb8;
  ParserTemplateBase *in_stack_fffffffffffffbc0;
  ErrorType in_stack_fffffffffffffbd8;
  Severity in_stack_fffffffffffffbdc;
  ParserTemplateBase *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf8;
  URI *in_stack_fffffffffffffc00;
  XSList<GeneratedSaxParser::ParserString> local_340;
  undefined1 local_330 [481];
  byte local_14f;
  byte local_14e;
  byte local_14d;
  ParserTemplateBase local_140;
  byte local_52;
  byte local_51;
  char *local_50;
  StackMemoryManager *local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  math__AttributeData *local_30;
  long *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::math__AttributeData>
                       (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a0ef83:
    if ((local_30->present_attributes & 1) == 0) {
      in_stack_fffffffffffffbb0 =
           (ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
            *)local_330;
      COLLADABU::URI::URI(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbb0);
    }
    if ((local_30->present_attributes & 2) == 0) {
      GeneratedSaxParser::XSList<GeneratedSaxParser::ParserString>::XSList(&local_340);
      (local_30->_class).data = local_340.data;
      (local_30->_class).size = local_340.size;
    }
    if ((local_30->present_attributes & 4) == 0) {
      other = (URI *)&stack0xfffffffffffffbd8;
      COLLADABU::URI::URI(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbb0,other);
      COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbb0);
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  do {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    local_40 = (ParserChar *)*local_38;
                                    if (local_40 == (ParserChar *)0x0) {
                                      local_40 = (ParserChar *)0x0;
                                      goto LAB_00a0ef83;
                                    }
                                    this_00 = (StackMemoryManager *)
                                              GeneratedSaxParser::Utils::calculateStringHash
                                                        (local_40);
                                    if (local_38 + 1 == (undefined8 *)0x0) {
                                      return false;
                                    }
                                    local_50 = (char *)local_38[1];
                                    local_38 = local_38 + 2;
                                    local_48 = this_00;
                                    if (this_00 != (StackMemoryManager *)0x6f4) break;
                                    local_30->id = local_50;
                                  }
                                  if (this_00 != (StackMemoryManager *)0x6f8b6) break;
                                  GeneratedSaxParser::Utils::toURI
                                            ((ParserChar **)
                                             CONCAT44(in_stack_fffffffffffffbdc,
                                                      in_stack_fffffffffffffbd8),in_RDI);
                                  COLLADABU::URI::operator=
                                            ((URI *)in_stack_fffffffffffffbb0,
                                             in_stack_fffffffffffffba8);
                                  COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbb0);
                                  if (((local_14f & 1) != 0) &&
                                     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                                        (in_stack_fffffffffffffbe0,
                                                         in_stack_fffffffffffffbdc,
                                                         in_stack_fffffffffffffbd8,
                                                         (StringHash)in_RDI,(StringHash)this_00,
                                                         (ParserChar *)in_stack_fffffffffffffbc0),
                                     bVar1)) {
                                    return false;
                                  }
                                  if ((local_14f & 1) == 0) {
                                    local_30->present_attributes = local_30->present_attributes | 4;
                                  }
                                }
                                if (this_00 != (StackMemoryManager *)0x74835) break;
                                local_30->name = local_50;
                              }
                              if (this_00 != (StackMemoryManager *)0x7c065) break;
                              local_30->type = local_50;
                            }
                            if (this_00 != (StackMemoryManager *)0x7f8b6) break;
                            local_30->xref = local_50;
                          }
                          if (this_00 !=
                              (StackMemoryManager *)((long)&__DT_RELA[0x12848].r_addend + 3)) break;
                          bVar1 = GeneratedSaxParser::
                                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                                  ::characterData2StringList
                                            (in_stack_fffffffffffffbb0,
                                             (ParserChar *)in_stack_fffffffffffffba8,
                                             (XSList<GeneratedSaxParser::ParserString> *)0xa0ece8);
                          local_14e = (bVar1 ^ 0xffU) & 1;
                          if ((local_14e != 0) &&
                             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc
                                                 ,in_stack_fffffffffffffbd8,(StringHash)in_RDI,
                                                 (StringHash)this_00,
                                                 (ParserChar *)in_stack_fffffffffffffbc0), bVar1)) {
                            return false;
                          }
                          if ((local_14e & 1) == 0) {
                            local_30->present_attributes = local_30->present_attributes | 2;
                          }
                        }
                        if (this_00 != (StackMemoryManager *)0x7ac025) break;
                        local_30->style = local_50;
                      }
                      if (this_00 != (StackMemoryManager *)0x7dfba8) break;
                      local_30->width = local_50;
                    }
                  } while (this_00 == (StackMemoryManager *)0x7f4353);
                  if (this_00 != (StackMemoryManager *)0x683b037) break;
                  in_stack_fffffffffffffbc0 = &local_140;
                  GeneratedSaxParser::Utils::toURI
                            ((ParserChar **)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),in_RDI);
                  COLLADABU::URI::operator=
                            ((URI *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
                  COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbb0);
                  if (((local_52 & 1) != 0) &&
                     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                        (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                                         in_stack_fffffffffffffbd8,(StringHash)in_RDI,
                                         (StringHash)this_00,(ParserChar *)in_stack_fffffffffffffbc0
                                        ), bVar1)) {
                    return false;
                  }
                  if ((local_52 & 1) == 0) {
                    local_30->present_attributes = local_30->present_attributes | 1;
                  }
                }
                if (this_00 != (StackMemoryManager *)0x6ebfdf4) break;
                local_30->height = local_50;
              }
              if (this_00 != (StackMemoryManager *)0x737a963) break;
              local_30->macros = local_50;
            }
            if (this_00 != (StackMemoryManager *)0x83bac94) break;
            local_30->alttext = local_50;
          }
          if (this_00 != (StackMemoryManager *)0x89c2ac5) break;
          local_30->baseline = local_50;
        }
        if (this_00 == (StackMemoryManager *)0xb0a72e9) break;
        if (this_00 == (StackMemoryManager *)0xcc8d607) {
          EVar2 = GeneratedSaxParser::Utils::
                  toEnum<COLLADASaxFWL15::ENUM__mathml__overflow,_unsigned_long,_(COLLADASaxFWL15::ENUM__mathml__overflow)4>
                            ((ParserChar *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),in_RDI,
                             (pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__overflow> *)
                             0xcc8d607,
                             (_func_unsigned_long_ParserChar_ptr_bool_ptr *)
                             in_stack_fffffffffffffbc0);
          local_30->overflow = EVar2;
          if (((local_51 & 1) != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                                 in_stack_fffffffffffffbd8,(StringHash)in_RDI,(StringHash)this_00,
                                 (ParserChar *)in_stack_fffffffffffffbc0), bVar1)) {
            return false;
          }
        }
        else {
          local_330._232_16_ =
               (undefined1  [16])
               GeneratedSaxParser::Utils::calculateStringHashWithNamespace
                         ((ParserChar *)in_stack_fffffffffffffbc0);
          if ((_Base_ptr)local_330._232_8_ != (_Base_ptr)0x7f4353) {
            if ((local_30->unknownAttributes).data == (char **)0x0) {
              ppcVar4 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                           (this_00,(size_t)in_stack_fffffffffffffbc0);
              (local_30->unknownAttributes).data = ppcVar4;
            }
            else {
              ppcVar4 = (char **)GeneratedSaxParser::StackMemoryManager::growObject
                                           ((StackMemoryManager *)in_stack_fffffffffffffbe8,
                                            (size_t)in_stack_fffffffffffffbe0);
              (local_30->unknownAttributes).data = ppcVar4;
            }
            (local_30->unknownAttributes).data[(local_30->unknownAttributes).size] = local_40;
            (local_30->unknownAttributes).data[(local_30->unknownAttributes).size + 1] = local_50;
            (local_30->unknownAttributes).size = (local_30->unknownAttributes).size + 2;
          }
        }
      }
      EVar3 = GeneratedSaxParser::Utils::
              toEnum<COLLADASaxFWL15::ENUM__mathml__display,_unsigned_long,_(COLLADASaxFWL15::ENUM__mathml__display)2>
                        ((ParserChar *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                         ,in_RDI,(pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__display> *)
                                 0xb0a72e9,
                         (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_stack_fffffffffffffbc0);
      local_30->display = EVar3;
    } while (((local_14d & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
                                in_stack_fffffffffffffbd8,(StringHash)in_RDI,(StringHash)this_00,
                                (ParserChar *)in_stack_fffffffffffffbc0), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__math( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__math( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

math__AttributeData* attributeData = newData<math__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_BASELINE:
    {

attributeData->baseline = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_OVERFLOW:
    {
bool failed;
attributeData->overflow = Utils::toEnum<ENUM__mathml__overflow, StringHash, ENUM__mathml__overflow__COUNT>(attributeValue, failed, ENUM__mathml__overflowMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_OVERFLOW,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ALTIMG:
    {
bool failed;
attributeData->altimg = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_ALTIMG,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_ALTTEXT:
    {

attributeData->alttext = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HEIGHT:
    {

attributeData->height = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_WIDTH:
    {

attributeData->width = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_MACROS:
    {

attributeData->macros = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DISPLAY:
    {
bool failed;
attributeData->display = Utils::toEnum<ENUM__mathml__display, StringHash, ENUM__mathml__display__COUNT>(attributeValue, failed, ENUM__mathml__displayMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_DISPLAY,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_MATH, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MATH,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MATH,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= math__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_XMLNS:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_XMLNS )
        {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;
        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_ALTIMG_PRESENT) == 0)
{
    attributeData->altimg = COLLADABU::URI("");
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & math__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}